

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void CompareOnTheFlyTexture(comparer_context *comp)

{
  scoped_chunk sVar1;
  uint uVar2;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  uint local_58;
  uint32_t h;
  allocator<char> local_41;
  string local_40;
  uint local_1c;
  uint32_t w;
  scoped_chunk chunk;
  comparer_context *comp_local;
  
  chunk.ctx = comp;
  scoped_chunk::scoped_chunk((scoped_chunk *)&stack0xffffffffffffffe8,comp,"aiTexture");
  sVar1.ctx = chunk.ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"mWidth",&local_41);
  uVar2 = comparer_context::cmp<unsigned_int>(sVar1.ctx,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  sVar1 = chunk;
  local_1c = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"mHeight",&local_79);
  uVar2 = comparer_context::cmp<unsigned_int>(sVar1.ctx,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  sVar1 = chunk;
  local_58 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"achFormatHint[0]",&local_a1);
  comparer_context::cmp<char>(sVar1.ctx,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"achFormatHint[1]",&local_c9);
  comparer_context::cmp<char>(sVar1.ctx,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"achFormatHint[2]",&local_f1);
  comparer_context::cmp<char>(sVar1.ctx,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  sVar1 = chunk;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"achFormatHint[3]",&local_119);
  comparer_context::cmp<char>(sVar1.ctx,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  scoped_chunk::~scoped_chunk((scoped_chunk *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void CompareOnTheFlyTexture(comparer_context& comp) {
    scoped_chunk chunk(comp,"aiTexture");

    const uint32_t w = comp.cmp<uint32_t>("mWidth");
    const uint32_t h = comp.cmp<uint32_t>("mHeight");
    (void)w; (void)h;
    comp.cmp<char>("achFormatHint[0]");
    comp.cmp<char>("achFormatHint[1]");
    comp.cmp<char>("achFormatHint[2]");
    comp.cmp<char>("achFormatHint[3]");
}